

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QJsonObject __thiscall QJsonDocument::object(QJsonDocument *this)

{
  bool bVar1;
  QCborValue *v;
  QCborContainerPrivate *pQVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  QCborContainerPrivate *container;
  QCborContainerPrivate *in_stack_ffffffffffffffc8;
  QExplicitlySharedDataPointer<QCborContainerPrivate> this_00;
  
  this_00.d.ptr = in_RDI.d.ptr;
  bVar1 = isObject((QJsonDocument *)in_stack_ffffffffffffffc8);
  if (bVar1) {
    v = &std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
         operator->((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
                    0x48efbe)->value;
    pQVar2 = QJsonPrivate::Value::container(v);
    if (pQVar2 != (QCborContainerPrivate *)0x0) {
      QJsonObject::QJsonObject((QJsonObject *)this_00.d.ptr,in_stack_ffffffffffffffc8);
      return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
             (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
    }
  }
  QJsonObject::QJsonObject((QJsonObject *)0x48eff0);
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonObject QJsonDocument::object() const
{
    if (isObject()) {
        if (auto container = QJsonPrivate::Value::container(d->value))
            return QJsonObject(container);
    }
    return QJsonObject();
}